

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O1

void __thiscall
chrono::ChTimestepperHHT::ChTimestepperHHT(ChTimestepperHHT *this,ChIntegrableIIorder *intgr)

{
  ChTimestepperIIorder::ChTimestepperIIorder(&this->super_ChTimestepperIIorder,intgr);
  (this->super_ChImplicitIterativeTimestepper).maxiters = 6;
  (this->super_ChImplicitIterativeTimestepper).reltol = 0.0001;
  (this->super_ChImplicitIterativeTimestepper).abstolS = 1e-10;
  (this->super_ChImplicitIterativeTimestepper).abstolL = 1e-10;
  (this->super_ChImplicitIterativeTimestepper).numiters = 0;
  (this->super_ChImplicitIterativeTimestepper).numsetups = 0;
  (this->super_ChImplicitIterativeTimestepper).numsolves = 0;
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperHHT_00b6bf40;
  (this->super_ChImplicitIterativeTimestepper)._vptr_ChImplicitIterativeTimestepper =
       (_func_int **)&PTR__ChTimestepperHHT_00b6bfc0;
  this->mode = ACCELERATION;
  this->scaling = false;
  ChStateDelta::ChStateDelta(&this->Da,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Dx,(ChIntegrable *)0x0);
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ChState::ChState(&this->Xnew,(ChIntegrable *)0x0);
  ChState::ChState(&this->Xprev,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Vnew,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Anew,(ChIntegrable *)0x0);
  (this->Lnew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Lnew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->step_control = true;
  this->maxiters_success = 3;
  this->req_successful_steps = 5;
  this->step_increase_factor = 2.0;
  this->step_decrease_factor = 0.5;
  this->h_min = 1e-10;
  this->h = 1000000.0;
  this->num_successful_steps = 0;
  this->modified_Newton = true;
  (this->ewtS).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->ewtS).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->ewtL).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->ewtL).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->convergence_trend_flag = true;
  this->threshold_R = 1000000000000.0;
  this->alpha = -0.2;
  this->gamma = 0.7;
  this->beta = 0.36;
  return;
}

Assistant:

ChTimestepperHHT::ChTimestepperHHT(ChIntegrableIIorder* intgr)
    : ChTimestepperIIorder(intgr),
      ChImplicitIterativeTimestepper(),
      mode(ACCELERATION),
      scaling(false),
      step_control(true),
      maxiters_success(3),
      req_successful_steps(5),
      step_increase_factor(2),
      step_decrease_factor(0.5),
      h_min(1e-10),
      h(1e6),
      num_successful_steps(0),
      modified_Newton(true) {
    SetAlpha(-0.2);  // default: some dissipation
}